

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

void __thiscall
helics::FederateInfo::loadInfoFromJson(FederateInfo *this,string *jsonString,bool runArgParser)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __s;
  bool bVar2;
  undefined1 auVar3 [8];
  value_t vVar4;
  json_value jVar5;
  undefined8 uVar6;
  const_iterator cVar7;
  reference pvVar8;
  void *pvVar9;
  pointer *__ptr;
  bool bVar10;
  json doc;
  istringstream jstringHelics;
  istringstream jstringHelicsSub;
  ifstream file;
  undefined1 local_568 [8];
  data local_560;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530 [3];
  ios_base local_4b8 [264];
  undefined1 local_3b0 [120];
  ios_base local_338 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [7];
  ios_base local_1b8 [400];
  
  local_560.m_type = null;
  local_560.m_value.object = (object_t *)0x0;
  fileops::loadJson((fileops *)local_540,(string *)jsonString);
  jVar5 = local_560.m_value;
  vVar4 = local_560.m_type;
  local_560.m_type = (value_t)local_540[0];
  local_540[0] = (fileops)vVar4;
  local_560.m_value = (json_value)local_540._8_8_;
  local_540._8_8_ = jVar5;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_540);
  local_230[0]._0_8_ = &local_560;
  loadJsonConfig(this,(JsonBuffer *)&local_230[0]._M_allocated_capacity);
  if ((fileops)local_560.m_type == (fileops)0x1) {
    cVar7 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
            ::_M_find_tr<char[7],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        *)local_560.m_value.object,(char (*) [7])0x3d59a4);
    if ((_Rb_tree_header *)cVar7._M_node ==
        &((local_560.m_value.object)->_M_t)._M_impl.super__Rb_tree_header) goto LAB_00237bca;
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_560,"helics");
    bVar2 = true;
    bVar10 = true;
    if ((pvVar8->m_data).m_type != object) goto LAB_00237bcd;
    cVar7 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
            ::_M_find_tr<char[7],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        *)(pvVar8->m_data).m_value.object,(char (*) [7])0x3d59a4);
    bVar10 = (_Rb_tree_header *)cVar7._M_node !=
             &(((pvVar8->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
LAB_00237bca:
    bVar10 = false;
LAB_00237bcd:
    bVar2 = bVar10;
    bVar10 = false;
  }
  if (!runArgParser) goto LAB_00238089;
  makeCLIApp((FederateInfo *)local_568);
  *(bool *)((long)local_568 + 0x48) = true;
  if (jsonString->_M_string_length == 0) {
LAB_00237c1d:
    std::ifstream::ifstream(local_230,(string *)jsonString,_S_in);
    auVar3 = local_568;
    if (*(uint32_t *)((long)local_568 + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_568);
      CLI::App::_configure((App *)auVar3);
    }
    CLI::App::_parse_stream((App *)auVar3,(istream *)local_230[0]._M_local_buf);
    CLI::App::run_callback((App *)auVar3,false,false);
    if (bVar2) {
      std::ios::clear((int)local_230 +
                      (int)((json_value *)(local_230[0]._M_allocated_capacity - 0x18))->
                           number_integer);
      std::istream::seekg(local_230,0,0);
      CLI::App::get_config_formatter_base((App *)local_3b0);
      uVar6 = local_3b0._0_8_;
      paVar1 = &local_530[0].field_2;
      local_530[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"helics","");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar6 + 0x30),
                local_530);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_530[0]._M_dataplus._M_p,local_530[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
      }
      auVar3 = local_568;
      if (*(uint32_t *)((long)local_568 + 0x2e4) == 0) {
        CLI::App::_validate((App *)local_568);
        CLI::App::_configure((App *)auVar3);
      }
      CLI::App::_parse_stream((App *)auVar3,(istream *)local_230[0]._M_local_buf);
      CLI::App::run_callback((App *)auVar3,false,false);
      if (bVar10) {
        std::ios::clear((int)local_230 +
                        (int)((json_value *)(local_230[0]._M_allocated_capacity - 0x18))->
                             number_integer);
        std::istream::seekg(local_230,0,0);
        CLI::App::get_config_formatter_base((App *)local_3b0);
        uVar6 = local_3b0._0_8_;
        local_530[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"helics.helics","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (uVar6 + 0x30),local_530);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_530[0]._M_dataplus._M_p,
                          local_530[0].field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
        }
        auVar3 = local_568;
        if (*(uint32_t *)((long)local_568 + 0x2e4) == 0) {
          CLI::App::_validate((App *)local_568);
          CLI::App::_configure((App *)auVar3);
        }
        CLI::App::_parse_stream((App *)auVar3,(istream *)local_230[0]._M_local_buf);
        CLI::App::run_callback((App *)auVar3,false,false);
      }
    }
    std::ifstream::~ifstream(local_230);
  }
  else {
    __s = (jsonString->_M_dataplus)._M_p;
    pvVar9 = memchr(__s,0x7b,jsonString->_M_string_length);
    if ((long)pvVar9 - (long)__s == -1 || pvVar9 == (void *)0x0) goto LAB_00237c1d;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_230[0]._M_local_buf,(string *)jsonString,_S_in);
    auVar3 = local_568;
    if (*(uint32_t *)((long)local_568 + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_568);
      CLI::App::_configure((App *)auVar3);
    }
    CLI::App::_parse_stream((App *)auVar3,(istream *)local_230[0]._M_local_buf);
    CLI::App::run_callback((App *)auVar3,false,false);
    if (bVar2) {
      CLI::App::get_config_formatter_base((App *)local_3b0);
      uVar6 = local_3b0._0_8_;
      local_530[0]._M_dataplus._M_p = (pointer)&local_530[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"helics","");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar6 + 0x30),
                local_530);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530[0]._M_dataplus._M_p != &local_530[0].field_2) {
        operator_delete(local_530[0]._M_dataplus._M_p,local_530[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_530,(string *)jsonString,_S_in);
      auVar3 = local_568;
      if (*(uint32_t *)((long)local_568 + 0x2e4) == 0) {
        CLI::App::_validate((App *)local_568);
        CLI::App::_configure((App *)auVar3);
      }
      CLI::App::_parse_stream((App *)auVar3,(istream *)local_530);
      CLI::App::run_callback((App *)auVar3,false,false);
      if (bVar10) {
        CLI::App::get_config_formatter_base((App *)local_550);
        local_3b0._0_8_ = local_3b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"helics.helics","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_550._0_8_ + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0);
        if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._8_8_);
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3b0,(string *)jsonString,_S_in);
        auVar3 = local_568;
        if (*(uint32_t *)((long)local_568 + 0x2e4) == 0) {
          CLI::App::_validate((App *)local_568);
          CLI::App::_configure((App *)auVar3);
        }
        CLI::App::_parse_stream((App *)auVar3,(istream *)local_3b0);
        CLI::App::run_callback((App *)auVar3,false,false);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b0);
        std::ios_base::~ios_base(local_338);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_530);
      std::ios_base::~ios_base(local_4b8);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_230[0]._M_local_buf);
    std::ios_base::~ios_base(local_1b8);
  }
  if (local_568 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_568)[1])();
  }
LAB_00238089:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_560);
  return;
}

Assistant:

void FederateInfo::loadInfoFromJson(const std::string& jsonString, bool runArgParser)
{
    nlohmann::json doc;
    try {
        doc = fileops::loadJson(jsonString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }
    loadJsonConfig(doc);
    const bool hasHelicsSection = doc.contains("helics");
    bool hasHelicsSubSection{false};
    if (hasHelicsSection) {
        hasHelicsSubSection = doc["helics"].contains("helics");
    }
    if (runArgParser) {
        auto app = makeCLIApp();
        app->allow_extras();
        try {
            if (jsonString.find('{') != std::string::npos) {
                std::istringstream jstring(jsonString);
                app->parse_from_stream(jstring);
                if (hasHelicsSection) {
                    app->get_config_formatter_base()->section("helics");
                    std::istringstream jstringHelics(jsonString);
                    app->parse_from_stream(jstringHelics);
                    if (hasHelicsSubSection) {
                        app->get_config_formatter_base()->section("helics.helics");
                        std::istringstream jstringHelicsSub(jsonString);
                        app->parse_from_stream(jstringHelicsSub);
                    }
                }
            } else {
                std::ifstream file(jsonString);
                app->parse_from_stream(file);
                if (hasHelicsSection) {
                    file.clear();
                    file.seekg(0);
                    app->get_config_formatter_base()->section("helics");
                    app->parse_from_stream(file);
                    if (hasHelicsSubSection) {
                        file.clear();
                        file.seekg(0);
                        app->get_config_formatter_base()->section("helics.helics");
                        app->parse_from_stream(file);
                    }
                }
            }
        }
        catch (const CLI::Error& clierror) {
            throw(InvalidIdentifier(clierror.what()));
        }
    }
}